

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

bool mjs::to_boolean(value *v)

{
  double dVar1;
  int *piVar2;
  wostream *pwVar3;
  char *pcVar4;
  undefined1 uVar5;
  wostringstream _woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  switch(v->type_) {
  case boolean:
    uVar5 = (v->field_1).b_;
    break;
  case number:
    dVar1 = (v->field_1).n_;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      return !NAN(dVar1);
    }
  case undefined:
  case null:
    uVar5 = 0;
    break;
  case string:
    piVar2 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(v->field_1).s_);
    uVar5 = *piVar2 != 0;
    break;
  case object:
    uVar5 = 1;
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_188);
    pwVar3 = std::operator<<((wostream *)local_188,"Not implemented: ");
    pcVar4 = string_value(v->type_);
    std::operator<<(pwVar3,pcVar4);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x97);
  }
  return (bool)uVar5;
}

Assistant:

bool to_boolean(const value& v) {
    switch (v.type()) {
    case value_type::undefined: return false;
    case value_type::null:      return false;
    case value_type::boolean:   return v.boolean_value();
    case value_type::number:    return v.number_value() != 0 && !std::isnan(v.number_value());
    case value_type::string:    return !v.string_value().view().empty();
    case value_type::object:    return true;
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}